

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O1

int coda_cursor_read_int32_partial_array(coda_cursor *cursor,long offset,long length,int32_t *dst)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  long lVar4;
  char *message;
  coda_native_type native_type;
  coda_type *pcVar5;
  long in_FS_OFFSET;
  long num_elements;
  long local_30;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar5 = (coda_type *)cursor->stack[cursor->n - 1].type, pcVar5 == (coda_type *)0x0)) {
    pcVar2 = "invalid cursor argument (%s:%u)";
    uVar3 = 0x11e8;
  }
  else {
    if (dst != (int32_t *)0x0) {
      if (99 < pcVar5->format) {
        pcVar5 = *(coda_type **)&pcVar5->type_class;
      }
      if (pcVar5->type_class != coda_array_class) {
        pcVar2 = coda_type_get_class_name(pcVar5->type_class);
        message = "cursor does not refer to an array (current type is %s)";
LAB_0014e2fc:
        coda_set_error(-0x69,message,pcVar2);
        return -1;
      }
      if (*(int *)(in_FS_OFFSET + -0x1208) != 0) {
        iVar1 = coda_cursor_get_num_elements(cursor,&local_30);
        if (iVar1 != 0) {
          return -1;
        }
        if ((offset < 0) || (local_30 <= offset)) {
          coda_set_error(-0x6b,"array offset (%ld) exceeds array range [0:%ld)",offset,local_30);
          return -1;
        }
        if (local_30 < length + offset) {
          coda_set_error(-0x6b,"array offset (%ld) + length (%ld) exceeds array range [0:%ld)",
                         offset,length);
          return -1;
        }
      }
      pcVar5 = *(coda_type **)(pcVar5 + 1);
      if (((pcVar5->type_class != coda_integer_class) && (pcVar5->type_class != coda_real_class)) ||
         ((*(int *)(in_FS_OFFSET + -0x1204) == 0 ||
          (native_type = coda_native_type_double, pcVar5[1].name == (char *)0x0)))) {
        native_type = pcVar5->read_type;
      }
      switch(native_type) {
      case coda_native_type_int8:
        iVar1 = read_int8_partial_array(cursor,offset,length,(int8_t *)dst);
        if (iVar1 != 0) {
          return -1;
        }
        if (0 < length) {
          lVar4 = length + 1;
          do {
            dst[lVar4 + -2] = (int)*(char *)((long)dst + lVar4 + -2);
            lVar4 = lVar4 + -1;
          } while (1 < lVar4);
        }
        break;
      case coda_native_type_uint8:
        iVar1 = read_uint8_partial_array(cursor,offset,length,(uint8_t *)dst);
        if (iVar1 != 0) {
          return -1;
        }
        if (0 < length) {
          lVar4 = length + 1;
          do {
            dst[lVar4 + -2] = (uint)*(byte *)((long)dst + lVar4 + -2);
            lVar4 = lVar4 + -1;
          } while (1 < lVar4);
        }
        break;
      case coda_native_type_int16:
        iVar1 = read_int16_partial_array(cursor,offset,length,(int16_t *)dst);
        if (iVar1 != 0) {
          return -1;
        }
        if (0 < length) {
          lVar4 = length + 1;
          do {
            dst[lVar4 + -2] = (int)*(short *)((long)dst + lVar4 * 2 + -4);
            lVar4 = lVar4 + -1;
          } while (1 < lVar4);
        }
        break;
      case coda_native_type_uint16:
        iVar1 = read_uint16_partial_array(cursor,offset,length,(uint16_t *)dst);
        if (iVar1 != 0) {
          return -1;
        }
        if (0 < length) {
          lVar4 = length + 1;
          do {
            dst[lVar4 + -2] = (uint)*(ushort *)((long)dst + lVar4 * 2 + -4);
            lVar4 = lVar4 + -1;
          } while (1 < lVar4);
        }
        break;
      case coda_native_type_int32:
        iVar1 = read_int32_partial_array(cursor,offset,length,dst);
        if (iVar1 != 0) {
          return -1;
        }
        break;
      default:
        pcVar2 = coda_type_get_native_type_name(native_type);
        message = "can not read %s data using a int32 data type";
        goto LAB_0014e2fc;
      }
      return 0;
    }
    pcVar2 = "dst argument is NULL (%s:%u)";
    uVar3 = 0x11ed;
  }
  coda_set_error(-100,pcVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                 ,uVar3);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_read_int32_partial_array(const coda_cursor *cursor, long offset, long length, int32_t *dst)
{
    coda_native_type read_type;
    coda_type *type;
    long i;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    /* check the range for offset and length */
    if (coda_option_perform_boundary_checks)
    {
        long num_elements;

        if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
        {
            return -1;
        }
        if (offset < 0 || offset >= num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array offset (%ld) exceeds array range [0:%ld)", offset,
                           num_elements);
            return -1;
        }
        if (offset + length > num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array offset (%ld) + length (%ld) exceeds array range "
                           "[0:%ld)", offset, length, num_elements);
            return -1;
        }
    }

    if (get_array_element_read_type(type, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_int8:
            if (read_int8_partial_array(cursor, offset, length, (int8_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (int32_t)((int8_t *)dst)[i];
            }
            break;
        case coda_native_type_uint8:
            if (read_uint8_partial_array(cursor, offset, length, (uint8_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (int32_t)((uint8_t *)dst)[i];
            }
            break;
        case coda_native_type_int16:
            if (read_int16_partial_array(cursor, offset, length, (int16_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (int32_t)((int16_t *)dst)[i];
            }
            break;
        case coda_native_type_uint16:
            if (read_uint16_partial_array(cursor, offset, length, (uint16_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (int32_t)((uint16_t *)dst)[i];
            }
            break;
        case coda_native_type_int32:
            if (read_int32_partial_array(cursor, offset, length, dst) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a int32 data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}